

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

void __thiscall
icu_63::MessagePatternList<double,_8>::copyFrom
          (MessagePatternList<double,_8> *this,MessagePatternList<double,_8> *other,int32_t length,
          UErrorCode *errorCode)

{
  double *pdVar1;
  
  if ((0 < length) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((this->a).capacity < length) {
      pdVar1 = (double *)uprv_malloc_63((ulong)(uint)length * 8);
      if (pdVar1 == (double *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      if ((this->a).needToRelease != '\0') {
        uprv_free_63((this->a).ptr);
      }
      (this->a).ptr = pdVar1;
      (this->a).capacity = length;
      (this->a).needToRelease = '\x01';
    }
    memcpy((this->a).ptr,(other->a).ptr,(ulong)(uint)length << 3);
    return;
  }
  return;
}

Assistant:

void
MessagePatternList<T, stackCapacity>::copyFrom(
        const MessagePatternList<T, stackCapacity> &other,
        int32_t length,
        UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && length>0) {
        if(length>a.getCapacity() && NULL==a.resize(length)) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        uprv_memcpy(a.getAlias(), other.a.getAlias(), (size_t)length*sizeof(T));
    }
}